

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_test.cpp
# Opt level: O0

void __thiscall serial_test::create_serial(serial_test *this,char *name,char *extension)

{
  bool bVar1;
  char *pcVar2;
  char *__s2;
  int *in_RDX;
  char *in_RSI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  serial s;
  plugin_type **in_stack_ffffffffffffff20;
  plugin_type **in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  AssertHelper local_b8;
  Message local_b0;
  int local_a8;
  undefined4 local_a4;
  AssertionResult local_a0;
  AssertHelper local_90;
  Message local_88;
  int local_80;
  undefined4 local_7c;
  AssertionResult local_78;
  uint local_64;
  AssertHelper local_60 [3];
  Message local_48;
  undefined8 local_40;
  undefined8 local_38;
  AssertionResult local_30;
  undefined8 local_20;
  int *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_40 = serial_create(in_RSI);
  local_38 = 0;
  local_20 = local_40;
  testing::internal::CmpHelperNE<plugin_type*,plugin_type*>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x11164f);
    testing::internal::AssertHelper::AssertHelper
              (local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=(local_60,&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    testing::Message::~Message((Message *)0x1116ac);
  }
  local_64 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111733);
  if (local_64 == 0) {
    local_7c = 0;
    pcVar2 = (char *)serial_name(local_20);
    local_80 = strcmp(local_10,pcVar2);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (local_10,in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28,
               (int *)in_stack_ffffffffffffff20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    pcVar2 = local_10;
    if (!bVar1) {
      testing::Message::Message(&local_88);
      in_stack_ffffffffffffff30 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1117d7);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
                 ,0x26,in_stack_ffffffffffffff30);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::Message::~Message((Message *)0x111825);
      pcVar2 = local_10;
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11188a);
    local_a4 = 0;
    __s2 = (char *)serial_extension(local_20);
    local_a8 = strcmp((char *)local_18,__s2);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (pcVar2,in_stack_ffffffffffffff30,local_18,(int *)in_stack_ffffffffffffff20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x111919);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/serial_test/source/serial_test.cpp"
                 ,0x28,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::Message::~Message((Message *)0x111967);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1119c9);
  }
  return;
}

Assistant:

void create_serial(const char *name, const char *extension)
	{
		serial s = serial_create(name);

		ASSERT_NE((serial)NULL, (serial)s);

		EXPECT_EQ((int)0, (int)strcmp(name, serial_name(s)));

		EXPECT_EQ((int)0, (int)strcmp(extension, serial_extension(s)));
	}